

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

int datatypes_match(MOJOSHADER_astDataType *a,MOJOSHADER_astDataType *b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  for (; a != b; a = (a->array).base) {
    iVar1 = 0;
    if (a->type != b->type) {
      return 0;
    }
    switch(a->type) {
    case MOJOSHADER_AST_DATATYPE_STRUCT:
      if ((a->array).elements != (b->array).elements) {
        return 0;
      }
      if (0 < (a->array).elements) {
        lVar2 = 0;
        lVar3 = 0;
        do {
          iVar1 = datatypes_match(*(MOJOSHADER_astDataType **)((long)(a->array).base + lVar2),
                                  *(MOJOSHADER_astDataType **)((long)(b->array).base + lVar2));
          if (iVar1 == 0) {
            return 0;
          }
          if (*(long *)((long)&((a->structure).members)->identifier + lVar2) !=
              *(long *)((long)&((b->structure).members)->identifier + lVar2)) {
            return 0;
          }
          lVar3 = lVar3 + 1;
          lVar2 = lVar2 + 0x10;
        } while (lVar3 < (a->array).elements);
      }
      goto LAB_0013ffc0;
    case MOJOSHADER_AST_DATATYPE_ARRAY:
    case MOJOSHADER_AST_DATATYPE_VECTOR:
      if ((a->array).elements != (b->array).elements) {
        return 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_MATRIX:
      if ((a->array).elements != (b->array).elements) {
        return 0;
      }
      if ((a->matrix).columns != (b->matrix).columns) {
        return 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_BUFFER:
      break;
    case MOJOSHADER_AST_DATATYPE_FUNCTION:
      if ((a->function).num_params != (b->function).num_params) {
        return 0;
      }
      if ((a->function).intrinsic != (b->function).intrinsic) {
        return 0;
      }
      iVar1 = datatypes_match((a->array).base,(b->array).base);
      if (iVar1 == 0) {
        return 0;
      }
      if (0 < (a->function).num_params) {
        lVar2 = 0;
        do {
          iVar1 = datatypes_match(*(MOJOSHADER_astDataType **)((a->user).name + lVar2 * 8),
                                  *(MOJOSHADER_astDataType **)((b->user).name + lVar2 * 8));
          if (iVar1 == 0) {
            return 0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < (a->function).num_params);
      }
      goto LAB_0013ffc0;
    case MOJOSHADER_AST_DATATYPE_USER:
      goto switchD_0013fecf_caseD_16;
    default:
      __assert_fail("0 && \"unexpected case\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x13d,
                    "int datatypes_match(const MOJOSHADER_astDataType *, const MOJOSHADER_astDataType *)"
                   );
    }
    b = (b->array).base;
  }
LAB_0013ffc0:
  iVar1 = 1;
switchD_0013fecf_caseD_16:
  return iVar1;
}

Assistant:

static int datatypes_match(const MOJOSHADER_astDataType *a,
                           const MOJOSHADER_astDataType *b)
{
    int i;

    if (a == b)
        return 1;
    else if (a->type != b->type)
        return 0;

    switch (a->type)
    {
        case MOJOSHADER_AST_DATATYPE_STRUCT:
            if (a->structure.member_count != b->structure.member_count)
                return 0;
            for (i = 0; i < a->structure.member_count; i++)
            {
                if (!datatypes_match(a->structure.members[i].datatype,
                                     b->structure.members[i].datatype))
                    return 0;
                // stringcache'd, pointer compare is safe.
                else if (a->structure.members[i].identifier !=
                         b->structure.members[i].identifier)
                    return 0;
            } // for
            return 1;

        case MOJOSHADER_AST_DATATYPE_ARRAY:
            if (a->array.elements != b->array.elements)
                return 0;
            else if (!datatypes_match(a->array.base, b->array.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_VECTOR:
            if (a->vector.elements != b->vector.elements)
                return 0;
            else if (!datatypes_match(a->vector.base, b->vector.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_MATRIX:
            if (a->matrix.rows != b->matrix.rows)
                return 0;
            else if (a->matrix.columns != b->matrix.columns)
                return 0;
            else if (!datatypes_match(a->matrix.base, b->matrix.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_BUFFER:
            return datatypes_match(a->buffer.base, b->buffer.base);

        case MOJOSHADER_AST_DATATYPE_FUNCTION:
            if (a->function.num_params != b->function.num_params)
                return 0;
            else if (a->function.intrinsic != b->function.intrinsic)
                return 0;
            else if (!datatypes_match(a->function.retval, b->function.retval))
                return 0;
            for (i = 0; i < a->function.num_params; i++)
            {
                if (!datatypes_match(a->function.params[i], b->function.params[i]))
                    return 0;
            } // for
            return 1;

        case MOJOSHADER_AST_DATATYPE_USER:
            return 0;  // pointers must match, this clearly didn't.

        default:
            assert(0 && "unexpected case");
            return 0;
    } // switch

    return 0;
}